

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

void __thiscall
ProString::
ProString<QStringBuilder<QStringBuilder<char_const(&)[29],QString&>,char_const(&)[2]>,QLatin1String&>
          (ProString *this,
          QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[29],_QString_&>,_const_char_(&)[2]>,_QLatin1String_&>
          *str)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[29],_QString_&>,_const_char_(&)[2]>,_QLatin1String_&>
  ::convertTo<QString>((QString *)&local_30,str);
  ProString(this,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProString(const QStringBuilder<A, B> &str)
        : ProString(QString(str))
    {}